

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::avx2::ConeCurveMiIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  byte bVar59;
  byte bVar60;
  ulong uVar61;
  Scene *pSVar62;
  undefined1 auVar63 [8];
  ulong uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined4 uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar83;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  float fVar102;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar119 [32];
  float fVar122;
  float fVar125;
  float fVar128;
  undefined1 auVar120 [32];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar152 [32];
  float fVar153;
  float fVar154;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar155 [64];
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar160 [32];
  float fVar167;
  float fVar169;
  undefined1 auVar168 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  float fVar173;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  RoundLineIntersectorHitM<8> hit;
  int local_5a4;
  RayQueryContext *local_5a0;
  Scene *local_598;
  RTCFilterFunctionNArguments local_590;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined4 local_54c;
  uint local_548;
  uint local_544;
  uint local_540;
  Primitive *local_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [16];
  undefined1 auStack_470 [16];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [16];
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [32];
  uint local_140 [4];
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  
  pSVar62 = context->scene;
  local_140[0] = line->sharedGeomID;
  uVar3 = (line->v0).field_0.i[0];
  pGVar11 = (pSVar62->geometries).items[local_140[0]].ptr;
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var13 = pGVar11[1].intersectionFilterN;
  uVar4 = (line->v0).field_0.i[1];
  uVar5 = (line->v0).field_0.i[2];
  uVar6 = (line->v0).field_0.i[4];
  uVar7 = (line->v0).field_0.i[5];
  auVar66._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * (long)p_Var13);
  auVar66._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar3 * (long)p_Var13);
  auVar73._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar7 * (long)p_Var13);
  auVar73._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar4 * (long)p_Var13);
  uVar8 = (line->v0).field_0.i[6];
  auVar77._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * (long)p_Var13);
  auVar77._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar5 * (long)p_Var13);
  uVar9 = (line->v0).field_0.i[3];
  uVar10 = (line->v0).field_0.i[7];
  auVar84._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar10 * (long)p_Var13);
  auVar84._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar9 * (long)p_Var13);
  auVar65 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * (long)p_Var13);
  auVar90._0_16_ =
       ZEXT116(0) * auVar65 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar3 + 1) * (long)p_Var13);
  auVar90._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar65;
  auVar65 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * (long)p_Var13);
  auVar119._0_16_ =
       ZEXT116(0) * auVar65 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar4 + 1) * (long)p_Var13);
  auVar119._16_16_ = ZEXT116(1) * auVar65;
  auVar65 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar8 + 1) * (long)p_Var13);
  auVar139._0_16_ =
       ZEXT116(0) * auVar65 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar5 + 1) * (long)p_Var13);
  auVar139._16_16_ = ZEXT116(1) * auVar65;
  auVar65 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar10 + 1) * (long)p_Var13);
  auVar103._0_16_ =
       ZEXT116(0) * auVar65 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar9 + 1) * (long)p_Var13);
  auVar103._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar65;
  auVar16 = vunpcklps_avx(auVar66,auVar77);
  auVar86 = vunpckhps_avx(auVar66,auVar77);
  auVar66 = vunpcklps_avx(auVar73,auVar84);
  auVar15 = vunpckhps_avx(auVar73,auVar84);
  auVar17 = vunpcklps_avx(auVar16,auVar66);
  auVar16 = vunpckhps_avx(auVar16,auVar66);
  auVar95 = vunpcklps_avx(auVar86,auVar15);
  auVar66 = vunpckhps_avx(auVar86,auVar15);
  auVar73 = vpunpckldq_avx2(auVar90,auVar139);
  auVar86 = vpunpckhdq_avx2(auVar90,auVar139);
  auVar77 = vpunpckldq_avx2(auVar119,auVar103);
  auVar15 = vpunpckhdq_avx2(auVar119,auVar103);
  auVar90 = vpunpckldq_avx2(auVar73,auVar77);
  auVar77 = vpunpckhdq_avx2(auVar73,auVar77);
  auVar103 = vpunpckldq_avx2(auVar86,auVar15);
  auVar84 = vpunpckhdq_avx2(auVar86,auVar15);
  uVar1 = line->leftExists;
  uVar2 = line->rightExists;
  auVar86 = vpcmpeqd_avx2(auVar86,auVar86);
  auVar73 = vpcmpeqd_avx2(auVar86,(undefined1  [32])(line->primIDs).field_0);
  local_140[1] = local_140[0];
  local_140[2] = local_140[0];
  local_140[3] = local_140[0];
  uStack_130 = local_140[0];
  uStack_12c = local_140[0];
  uStack_128 = local_140[0];
  uStack_124 = local_140[0];
  auVar86._0_16_ = *(undefined1 (*) [16])&ray->dir;
  auVar86._16_4_ = ray->tfar;
  auVar86._20_4_ = ray->mask;
  auVar86._24_4_ = ray->id;
  auVar86._28_4_ = ray->flags;
  auVar65 = *(undefined1 (*) [16])((long)&(ray->dir).field_0 + 4);
  fVar118 = (ray->dir).field_0.m128[2];
  fVar123 = (ray->dir).field_0.m128[3];
  auVar76._0_4_ = fVar118 * fVar118;
  auVar76._4_4_ = fVar123 * fVar123;
  auVar76._8_4_ = ray->tfar * ray->tfar;
  auVar76._12_4_ = (float)ray->mask * (float)ray->mask;
  auVar65 = vfmadd231ps_fma(auVar76,auVar65,auVar65);
  auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar86,auVar86);
  uVar75 = auVar65._0_4_;
  auVar67._4_4_ = uVar75;
  auVar67._0_4_ = uVar75;
  auVar67._8_4_ = uVar75;
  auVar67._12_4_ = uVar75;
  auVar67._16_4_ = uVar75;
  auVar67._20_4_ = uVar75;
  auVar67._24_4_ = uVar75;
  auVar67._28_4_ = uVar75;
  auVar86 = vrcpps_avx(auVar67);
  fVar118 = (ray->org).field_0.m128[1];
  auVar74._4_4_ = fVar118;
  auVar74._0_4_ = fVar118;
  auVar74._8_4_ = fVar118;
  auVar74._12_4_ = fVar118;
  auVar74._16_4_ = fVar118;
  auVar74._20_4_ = fVar118;
  auVar74._24_4_ = fVar118;
  auVar74._28_4_ = fVar118;
  auVar91._8_4_ = 0x3f800000;
  auVar91._0_8_ = &DAT_3f8000003f800000;
  auVar91._12_4_ = 0x3f800000;
  auVar91._16_4_ = 0x3f800000;
  auVar91._20_4_ = 0x3f800000;
  auVar91._24_4_ = 0x3f800000;
  auVar91._28_4_ = 0x3f800000;
  auVar65 = vfnmadd213ps_fma(auVar67,auVar86,auVar91);
  auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar86,auVar86);
  fStack_364 = auVar95._28_4_;
  auVar170._4_4_ = (auVar17._4_4_ + auVar90._4_4_) * 0.5;
  auVar170._0_4_ = (auVar17._0_4_ + auVar90._0_4_) * 0.5;
  auVar170._8_4_ = (auVar17._8_4_ + auVar90._8_4_) * 0.5;
  auVar170._12_4_ = (auVar17._12_4_ + auVar90._12_4_) * 0.5;
  auVar170._16_4_ = (auVar17._16_4_ + auVar90._16_4_) * 0.5;
  auVar170._20_4_ = (auVar17._20_4_ + auVar90._20_4_) * 0.5;
  auVar170._24_4_ = (auVar17._24_4_ + auVar90._24_4_) * 0.5;
  auVar170._28_4_ = auVar17._28_4_ + auVar90._28_4_;
  auVar15._4_4_ = (auVar16._4_4_ + auVar77._4_4_) * 0.5;
  auVar15._0_4_ = (auVar16._0_4_ + auVar77._0_4_) * 0.5;
  auVar15._8_4_ = (auVar16._8_4_ + auVar77._8_4_) * 0.5;
  auVar15._12_4_ = (auVar16._12_4_ + auVar77._12_4_) * 0.5;
  auVar15._16_4_ = (auVar16._16_4_ + auVar77._16_4_) * 0.5;
  auVar15._20_4_ = (auVar16._20_4_ + auVar77._20_4_) * 0.5;
  auVar15._24_4_ = (auVar16._24_4_ + auVar77._24_4_) * 0.5;
  auVar15._28_4_ = auVar16._28_4_ + auVar77._28_4_;
  auVar22._4_4_ = (auVar95._4_4_ + auVar103._4_4_) * 0.5;
  auVar22._0_4_ = (auVar95._0_4_ + auVar103._0_4_) * 0.5;
  auVar22._8_4_ = (auVar95._8_4_ + auVar103._8_4_) * 0.5;
  auVar22._12_4_ = (auVar95._12_4_ + auVar103._12_4_) * 0.5;
  auVar22._16_4_ = (auVar95._16_4_ + auVar103._16_4_) * 0.5;
  auVar22._20_4_ = (auVar95._20_4_ + auVar103._20_4_) * 0.5;
  auVar22._24_4_ = (auVar95._24_4_ + auVar103._24_4_) * 0.5;
  auVar22._28_4_ = fStack_364 + auVar103._28_4_;
  fVar123 = (ray->org).field_0.m128[2];
  auVar140._4_4_ = fVar123;
  auVar140._0_4_ = fVar123;
  auVar140._8_4_ = fVar123;
  auVar140._12_4_ = fVar123;
  auVar140._16_4_ = fVar123;
  auVar140._20_4_ = fVar123;
  auVar140._24_4_ = fVar123;
  auVar140._28_4_ = fVar123;
  auVar86 = vsubps_avx(auVar15,auVar74);
  auVar15 = vsubps_avx(auVar22,auVar140);
  local_320 = (ray->dir).field_0.m128[2];
  auVar23._4_4_ = auVar15._4_4_ * local_320;
  auVar23._0_4_ = auVar15._0_4_ * local_320;
  auVar23._8_4_ = auVar15._8_4_ * local_320;
  auVar23._12_4_ = auVar15._12_4_ * local_320;
  auVar23._16_4_ = auVar15._16_4_ * local_320;
  auVar23._20_4_ = auVar15._20_4_ * local_320;
  auVar23._24_4_ = auVar15._24_4_ * local_320;
  auVar23._28_4_ = auVar15._28_4_;
  fStack_84 = (ray->dir).field_0.m128[1];
  local_180._4_4_ = fStack_84;
  local_180._0_4_ = fStack_84;
  fStack_178 = fStack_84;
  fStack_174 = fStack_84;
  fStack_170 = fStack_84;
  fStack_16c = fStack_84;
  fStack_168 = fStack_84;
  register0x000012dc = fStack_84;
  auVar76 = vfmadd231ps_fma(auVar23,_local_180,auVar86);
  fVar126 = (ray->org).field_0.m128[0];
  auVar92._4_4_ = fVar126;
  auVar92._0_4_ = fVar126;
  auVar92._8_4_ = fVar126;
  auVar92._12_4_ = fVar126;
  auVar92._16_4_ = fVar126;
  auVar92._20_4_ = fVar126;
  auVar92._24_4_ = fVar126;
  auVar92._28_4_ = fVar126;
  fVar129 = (ray->dir).field_0.m128[0];
  local_1a0._4_4_ = fVar129;
  local_1a0._0_4_ = fVar129;
  fStack_198 = fVar129;
  fStack_194 = fVar129;
  fStack_190 = fVar129;
  fStack_18c = fVar129;
  fStack_188 = fVar129;
  register0x0000139c = fVar129;
  auVar86 = vsubps_avx(auVar170,auVar92);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),_local_1a0,auVar86);
  fVar116 = auVar76._0_4_ * auVar65._0_4_;
  fVar121 = auVar76._4_4_ * auVar65._4_4_;
  fVar124 = auVar76._8_4_ * auVar65._8_4_;
  fVar127 = auVar76._12_4_ * auVar65._12_4_;
  auVar68._0_4_ = fVar126 + fVar116 * fVar129;
  auVar68._4_4_ = fVar126 + fVar121 * fVar129;
  auVar68._8_4_ = fVar126 + fVar124 * fVar129;
  auVar68._12_4_ = fVar126 + fVar127 * fVar129;
  auVar68._16_4_ = fVar126 + fVar129 * 0.0;
  auVar68._20_4_ = fVar126 + fVar129 * 0.0;
  auVar68._24_4_ = fVar126 + fVar129 * 0.0;
  auVar68._28_4_ = fVar126 + 0.0;
  auVar78._0_4_ = fVar118 + fVar116 * fStack_84;
  auVar78._4_4_ = fVar118 + fVar121 * fStack_84;
  auVar78._8_4_ = fVar118 + fVar124 * fStack_84;
  auVar78._12_4_ = fVar118 + fVar127 * fStack_84;
  auVar78._16_4_ = fVar118 + fStack_84 * 0.0;
  auVar78._20_4_ = fVar118 + fStack_84 * 0.0;
  auVar78._24_4_ = fVar118 + fStack_84 * 0.0;
  auVar78._28_4_ = fVar118 + auVar86._28_4_;
  local_160 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar124,CONCAT44(fVar121,fVar116))));
  auVar93._0_4_ = fVar123 + local_320 * fVar116;
  auVar93._4_4_ = fVar123 + local_320 * fVar121;
  auVar93._8_4_ = fVar123 + local_320 * fVar124;
  auVar93._12_4_ = fVar123 + local_320 * fVar127;
  auVar93._16_4_ = fVar123 + local_320 * 0.0;
  auVar93._20_4_ = fVar123 + local_320 * 0.0;
  auVar93._24_4_ = fVar123 + local_320 * 0.0;
  auVar93._28_4_ = fVar123 + fVar118;
  local_1c0 = vsubps_avx(auVar90,auVar17);
  _local_520 = vsubps_avx(auVar68,auVar17);
  local_1e0 = vsubps_avx(auVar77,auVar16);
  _local_460 = vsubps_avx(auVar78,auVar16);
  local_400 = vsubps_avx(auVar103,auVar95);
  _local_3e0 = vsubps_avx(auVar93,auVar95);
  fVar167 = local_400._0_4_;
  fVar169 = local_400._4_4_;
  auVar17._4_4_ = fVar169 * fVar169;
  auVar17._0_4_ = fVar167 * fVar167;
  fVar146 = local_400._8_4_;
  auVar17._8_4_ = fVar146 * fVar146;
  fVar150 = local_400._12_4_;
  auVar17._12_4_ = fVar150 * fVar150;
  fVar159 = local_400._16_4_;
  auVar17._16_4_ = fVar159 * fVar159;
  fVar162 = local_400._20_4_;
  auVar17._20_4_ = fVar162 * fVar162;
  fVar164 = local_400._24_4_;
  auVar17._24_4_ = fVar164 * fVar164;
  auVar17._28_4_ = auVar103._28_4_;
  auVar65 = vfmadd231ps_fma(auVar17,local_1e0,local_1e0);
  auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),local_1c0,local_1c0);
  fVar173 = local_3e0._0_4_;
  fVar176 = local_3e0._4_4_;
  auVar95._4_4_ = fVar176 * fVar169;
  auVar95._0_4_ = fVar173 * fVar167;
  fVar177 = local_3e0._8_4_;
  auVar95._8_4_ = fVar177 * fVar146;
  fVar178 = local_3e0._12_4_;
  auVar95._12_4_ = fVar178 * fVar150;
  fVar179 = local_3e0._16_4_;
  auVar95._16_4_ = fVar179 * fVar159;
  fVar180 = local_3e0._20_4_;
  auVar95._20_4_ = fVar180 * fVar162;
  fVar181 = local_3e0._24_4_;
  auVar95._24_4_ = fVar181 * fVar164;
  auVar95._28_4_ = auVar16._28_4_;
  auVar76 = vfmadd231ps_fma(auVar95,_local_460,local_1e0);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),_local_520,local_1c0);
  auVar16._4_4_ = local_320 * fVar169;
  auVar16._0_4_ = local_320 * fVar167;
  auVar16._8_4_ = local_320 * fVar146;
  auVar16._12_4_ = local_320 * fVar150;
  auVar16._16_4_ = local_320 * fVar159;
  auVar16._20_4_ = local_320 * fVar162;
  auVar16._24_4_ = local_320 * fVar164;
  auVar16._28_4_ = fVar123;
  auVar20 = vfmadd231ps_fma(auVar16,_local_180,local_1e0);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),_local_1a0,local_1c0);
  auVar86 = vsubps_avx(auVar66,auVar84);
  fVar133 = auVar86._0_4_;
  fVar138 = auVar86._4_4_;
  fVar148 = auVar86._8_4_;
  fVar151 = auVar86._12_4_;
  fVar161 = auVar86._16_4_;
  fVar163 = auVar86._20_4_;
  fVar165 = auVar86._24_4_;
  fVar166 = local_400._28_4_;
  fVar118 = auVar65._0_4_;
  fVar102 = fVar133 * fVar133 + fVar118;
  fVar123 = auVar65._4_4_;
  fVar110 = fVar138 * fVar138 + fVar123;
  fVar126 = auVar65._8_4_;
  fVar111 = fVar148 * fVar148 + fVar126;
  fVar131 = auVar65._12_4_;
  fVar112 = fVar151 * fVar151 + fVar131;
  fVar113 = fVar161 * fVar161 + 0.0;
  fVar114 = fVar163 * fVar163 + 0.0;
  fVar115 = fVar165 * fVar165 + 0.0;
  auVar24._4_4_ = local_320 * fVar176;
  auVar24._0_4_ = local_320 * fVar173;
  auVar24._8_4_ = local_320 * fVar177;
  auVar24._12_4_ = local_320 * fVar178;
  auVar24._16_4_ = local_320 * fVar179;
  auVar24._20_4_ = local_320 * fVar180;
  auVar24._24_4_ = local_320 * fVar181;
  auVar24._28_4_ = fVar166;
  auVar21 = vfmadd231ps_fma(auVar24,_local_180,_local_460);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),_local_1a0,_local_520);
  fVar83 = fVar118 * fVar118;
  fVar87 = fVar123 * fVar123;
  fVar88 = fVar126 * fVar126;
  fVar89 = fVar131 * fVar131;
  uStack_1e4 = fStack_84;
  _local_200 = ZEXT1628(CONCAT412(fVar89,CONCAT48(fVar88,CONCAT44(fVar87,fVar83))));
  fVar135 = auVar76._0_4_;
  fVar137 = auVar20._0_4_;
  fVar144 = auVar76._4_4_;
  fVar143 = auVar20._4_4_;
  fVar149 = auVar76._8_4_;
  fVar145 = auVar20._8_4_;
  fVar153 = auVar76._12_4_;
  fVar147 = auVar20._12_4_;
  auVar25._4_4_ = fVar110 * fVar143 * fVar144;
  auVar25._0_4_ = fVar102 * fVar137 * fVar135;
  auVar25._8_4_ = fVar111 * fVar145 * fVar149;
  auVar25._12_4_ = fVar112 * fVar147 * fVar153;
  auVar25._16_4_ = fVar113 * 0.0;
  auVar25._20_4_ = fVar114 * 0.0;
  auVar25._24_4_ = fVar115 * 0.0;
  auVar25._28_4_ = fVar129;
  auVar15 = vsubps_avx(ZEXT1632(CONCAT412(fVar89 * auVar21._12_4_,
                                          CONCAT48(fVar88 * auVar21._8_4_,
                                                   CONCAT44(fVar87 * auVar21._4_4_,
                                                            fVar83 * auVar21._0_4_)))),auVar25);
  auVar95 = ZEXT1632(auVar65);
  local_340 = auVar66._0_4_;
  fVar117 = local_340 * fVar118;
  fStack_33c = auVar66._4_4_;
  fVar122 = fStack_33c * fVar123;
  auVar26._4_4_ = fVar122;
  auVar26._0_4_ = fVar117;
  fStack_338 = auVar66._8_4_;
  fVar125 = fStack_338 * fVar126;
  auVar26._8_4_ = fVar125;
  fStack_334 = auVar66._12_4_;
  fVar128 = fStack_334 * fVar131;
  auVar26._12_4_ = fVar128;
  fStack_330 = auVar66._16_4_;
  fVar130 = fStack_330 * 0.0;
  auVar26._16_4_ = fVar130;
  fStack_32c = auVar66._20_4_;
  fVar132 = fStack_32c * 0.0;
  auVar26._20_4_ = fVar132;
  fStack_328 = auVar66._24_4_;
  fVar14 = auVar66._28_4_;
  fVar134 = fStack_328 * 0.0;
  auVar26._24_4_ = fVar134;
  auVar26._28_4_ = fVar14;
  auVar98._0_4_ = fVar117 * fVar137 * fVar133 + auVar15._0_4_;
  auVar98._4_4_ = fVar122 * fVar143 * fVar138 + auVar15._4_4_;
  auVar98._8_4_ = fVar125 * fVar145 * fVar148 + auVar15._8_4_;
  auVar98._12_4_ = fVar128 * fVar147 * fVar151 + auVar15._12_4_;
  auVar98._16_4_ = fVar130 * fVar161 * 0.0 + auVar15._16_4_;
  auVar98._20_4_ = fVar132 * fVar163 * 0.0 + auVar15._20_4_;
  auVar98._24_4_ = fVar134 * fVar165 * 0.0 + auVar15._24_4_;
  auVar98._28_4_ = fVar129 + auVar15._28_4_;
  auVar27._4_4_ = fVar176 * fVar176;
  auVar27._0_4_ = fVar173 * fVar173;
  auVar27._8_4_ = fVar177 * fVar177;
  auVar27._12_4_ = fVar178 * fVar178;
  auVar27._16_4_ = fVar179 * fVar179;
  auVar27._20_4_ = fVar180 * fVar180;
  auVar27._24_4_ = fVar181 * fVar181;
  auVar27._28_4_ = auVar15._28_4_;
  auVar65 = vfmadd231ps_fma(auVar27,_local_460,_local_460);
  auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),_local_520,_local_520);
  fVar136 = local_520._28_4_;
  auVar28._4_4_ = fVar144 * fVar144 * fVar110;
  auVar28._0_4_ = fVar135 * fVar135 * fVar102;
  auVar28._8_4_ = fVar149 * fVar149 * fVar111;
  auVar28._12_4_ = fVar153 * fVar153 * fVar112;
  auVar28._16_4_ = fVar113 * 0.0;
  auVar28._20_4_ = fVar114 * 0.0;
  auVar28._24_4_ = fVar115 * 0.0;
  auVar28._28_4_ = fVar136;
  auVar15 = vsubps_avx(ZEXT1632(CONCAT412(fVar89 * auVar65._12_4_,
                                          CONCAT48(fVar88 * auVar65._8_4_,
                                                   CONCAT44(fVar87 * auVar65._4_4_,
                                                            fVar83 * auVar65._0_4_)))),auVar28);
  auVar29._4_4_ = (fVar138 + fVar138) * fVar144;
  auVar29._0_4_ = (fVar133 + fVar133) * fVar135;
  auVar29._8_4_ = (fVar148 + fVar148) * fVar149;
  auVar29._12_4_ = (fVar151 + fVar151) * fVar153;
  auVar29._16_4_ = (fVar161 + fVar161) * 0.0;
  auVar29._20_4_ = (fVar163 + fVar163) * 0.0;
  auVar29._24_4_ = (fVar165 + fVar165) * 0.0;
  auVar29._28_4_ = auVar86._28_4_ + auVar86._28_4_;
  auVar86 = vsubps_avx(auVar29,auVar26);
  fVar154 = fVar137 * fVar137;
  fVar156 = fVar143 * fVar143;
  fVar157 = fVar145 * fVar145;
  fVar158 = fVar147 * fVar147;
  auVar30._4_4_ = fVar156 * fVar110;
  auVar30._0_4_ = fVar154 * fVar102;
  auVar30._8_4_ = fVar157 * fVar111;
  auVar30._12_4_ = fVar158 * fVar112;
  auVar30._16_4_ = fVar113 * 0.0;
  auVar30._20_4_ = fVar114 * 0.0;
  auVar30._24_4_ = fVar115 * 0.0;
  auVar30._28_4_ = auVar15._28_4_;
  auVar16 = vsubps_avx(_local_200,auVar30);
  auVar31._4_4_ = (fVar122 * auVar86._4_4_ + auVar15._4_4_) * auVar16._4_4_;
  auVar31._0_4_ = (fVar117 * auVar86._0_4_ + auVar15._0_4_) * auVar16._0_4_;
  auVar31._8_4_ = (fVar125 * auVar86._8_4_ + auVar15._8_4_) * auVar16._8_4_;
  auVar31._12_4_ = (fVar128 * auVar86._12_4_ + auVar15._12_4_) * auVar16._12_4_;
  auVar31._16_4_ = (fVar130 * auVar86._16_4_ + auVar15._16_4_) * auVar16._16_4_;
  auVar31._20_4_ = (fVar132 * auVar86._20_4_ + auVar15._20_4_) * auVar16._20_4_;
  auVar31._24_4_ = (fVar134 * auVar86._24_4_ + auVar15._24_4_) * auVar16._24_4_;
  auVar31._28_4_ = fVar14 + auVar15._28_4_;
  auVar32._4_4_ = auVar98._4_4_ * auVar98._4_4_;
  auVar32._0_4_ = auVar98._0_4_ * auVar98._0_4_;
  auVar32._8_4_ = auVar98._8_4_ * auVar98._8_4_;
  auVar32._12_4_ = auVar98._12_4_ * auVar98._12_4_;
  auVar32._16_4_ = auVar98._16_4_ * auVar98._16_4_;
  auVar32._20_4_ = auVar98._20_4_ * auVar98._20_4_;
  fVar117 = local_460._28_4_;
  auVar32._24_4_ = auVar98._24_4_ * auVar98._24_4_;
  auVar32._28_4_ = fVar117;
  auVar15 = vsubps_avx(auVar32,auVar31);
  auVar170 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar86 = vcmpps_avx(auVar15,auVar170,5);
  auVar17 = auVar86 & ~auVar73;
  if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0x7f,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar17 >> 0xbf,0) != '\0') ||
      (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0') {
    auVar86 = vandnps_avx(auVar73,auVar86);
    auVar65 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
    auVar73 = vsubps_avx(auVar68,auVar90);
    auVar90 = vsubps_avx(auVar78,auVar77);
    auVar77 = vsubps_avx(auVar93,auVar103);
    auVar69._2_2_ = 0;
    auVar69._0_2_ = uVar2;
    auVar69._4_2_ = uVar2;
    auVar69._6_2_ = 0;
    auVar69._8_2_ = uVar2;
    auVar69._10_2_ = 0;
    auVar69._12_2_ = uVar2;
    auVar69._14_2_ = 0;
    auVar69._16_2_ = uVar2;
    auVar69._18_2_ = 0;
    auVar69._20_2_ = uVar2;
    auVar69._22_2_ = 0;
    auVar69._24_2_ = uVar2;
    auVar69._26_2_ = 0;
    auVar69._28_2_ = uVar2;
    auVar69._30_2_ = 0;
    auVar17 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar86 = vpand_avx2(auVar69,auVar17);
    auVar86 = vpcmpeqd_avx2(auVar170,auVar86);
    auVar76 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
    auVar70._2_2_ = 0;
    auVar70._0_2_ = uVar1;
    auVar70._4_2_ = uVar1;
    auVar70._6_2_ = 0;
    auVar70._8_2_ = uVar1;
    auVar70._10_2_ = 0;
    auVar70._12_2_ = uVar1;
    auVar70._14_2_ = 0;
    auVar70._16_2_ = uVar1;
    auVar70._18_2_ = 0;
    auVar70._20_2_ = uVar1;
    auVar70._22_2_ = 0;
    auVar70._24_2_ = uVar1;
    auVar70._26_2_ = 0;
    auVar70._28_2_ = uVar1;
    auVar70._30_2_ = 0;
    auVar15 = vsqrtps_avx(auVar15);
    auVar103 = vpand_avx2(auVar70,auVar17);
    auVar86 = vrcpps_avx(auVar16);
    uStack_370 = 0;
    uStack_36c = 0;
    uStack_368 = 0;
    auVar160._8_4_ = 0x3f800000;
    auVar160._0_8_ = &DAT_3f8000003f800000;
    auVar160._12_4_ = 0x3f800000;
    auVar160._16_4_ = 0x3f800000;
    auVar160._20_4_ = 0x3f800000;
    auVar160._24_4_ = 0x3f800000;
    auVar160._28_4_ = 0x3f800000;
    auVar21 = vfnmadd213ps_fma(auVar86,auVar16,auVar160);
    auVar104._8_4_ = 0x7fffffff;
    auVar104._0_8_ = 0x7fffffff7fffffff;
    auVar104._12_4_ = 0x7fffffff;
    auVar104._16_4_ = 0x7fffffff;
    auVar104._20_4_ = 0x7fffffff;
    auVar104._24_4_ = 0x7fffffff;
    auVar104._28_4_ = 0x7fffffff;
    auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar86,auVar86);
    auVar86 = vandps_avx(auVar16,auVar104);
    auVar79._8_4_ = 0x219392ef;
    auVar79._0_8_ = 0x219392ef219392ef;
    auVar79._12_4_ = 0x219392ef;
    auVar79._16_4_ = 0x219392ef;
    auVar79._20_4_ = 0x219392ef;
    auVar79._24_4_ = 0x219392ef;
    auVar79._28_4_ = 0x219392ef;
    auVar86 = vcmpps_avx(auVar86,auVar79,2);
    uVar64 = CONCAT44(auVar98._4_4_,auVar98._0_4_);
    auVar80._0_8_ = uVar64 ^ 0x8000000080000000;
    auVar80._8_4_ = -auVar98._8_4_;
    auVar80._12_4_ = -auVar98._12_4_;
    auVar80._16_4_ = -auVar98._16_4_;
    auVar80._20_4_ = -auVar98._20_4_;
    auVar80._24_4_ = -auVar98._24_4_;
    auVar80._28_4_ = -auVar98._28_4_;
    auVar16 = vsubps_avx(auVar80,auVar15);
    auVar17 = vsubps_avx(auVar15,auVar98);
    auVar33._4_4_ = auVar21._4_4_ * auVar16._4_4_;
    auVar33._0_4_ = auVar21._0_4_ * auVar16._0_4_;
    auVar33._8_4_ = auVar21._8_4_ * auVar16._8_4_;
    auVar33._12_4_ = auVar21._12_4_ * auVar16._12_4_;
    auVar33._16_4_ = auVar16._16_4_ * 0.0;
    auVar33._20_4_ = auVar16._20_4_ * 0.0;
    auVar33._24_4_ = auVar16._24_4_ * 0.0;
    auVar33._28_4_ = auVar16._28_4_;
    auVar34._4_4_ = auVar21._4_4_ * auVar17._4_4_;
    auVar34._0_4_ = auVar21._0_4_ * auVar17._0_4_;
    auVar34._8_4_ = auVar21._8_4_ * auVar17._8_4_;
    auVar34._12_4_ = auVar21._12_4_ * auVar17._12_4_;
    auVar34._16_4_ = auVar17._16_4_ * 0.0;
    auVar34._20_4_ = auVar17._20_4_ * 0.0;
    auVar34._24_4_ = auVar17._24_4_ * 0.0;
    auVar34._28_4_ = auVar17._28_4_;
    auVar105._8_4_ = 0xff800000;
    auVar105._0_8_ = 0xff800000ff800000;
    auVar105._12_4_ = 0xff800000;
    auVar105._16_4_ = 0xff800000;
    auVar105._20_4_ = 0xff800000;
    auVar105._24_4_ = 0xff800000;
    auVar105._28_4_ = 0xff800000;
    auVar15 = vblendvps_avx(auVar33,auVar105,auVar86);
    auVar81._8_4_ = 0x7f800000;
    auVar81._0_8_ = 0x7f8000007f800000;
    auVar81._12_4_ = 0x7f800000;
    auVar81._16_4_ = 0x7f800000;
    auVar81._20_4_ = 0x7f800000;
    auVar81._24_4_ = 0x7f800000;
    auVar81._28_4_ = 0x7f800000;
    auVar16 = vblendvps_avx(auVar34,auVar81,auVar86);
    auVar106._0_4_ = fVar135 + fVar137 * auVar15._0_4_;
    auVar106._4_4_ = fVar144 + fVar143 * auVar15._4_4_;
    auVar106._8_4_ = fVar149 + fVar145 * auVar15._8_4_;
    auVar106._12_4_ = fVar153 + fVar147 * auVar15._12_4_;
    auVar106._16_4_ = auVar15._16_4_ * 0.0 + 0.0;
    auVar106._20_4_ = auVar15._20_4_ * 0.0 + 0.0;
    auVar106._24_4_ = auVar15._24_4_ * 0.0 + 0.0;
    auVar106._28_4_ = auVar17._28_4_ + 0.0;
    auVar170 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar86 = vcmpps_avx(auVar106,auVar170,6);
    auVar17 = vcmpps_avx(auVar106,auVar95,1);
    auVar86 = vandps_avx(auVar17,auVar86);
    auVar21 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
    auVar21 = vpand_avx(auVar65,auVar21);
    auVar86 = vpmovsxwd_avx2(auVar21);
    local_4a0 = vblendvps_avx(auVar81,auVar15,auVar86);
    auVar17 = vpcmpeqd_avx2(auVar170,auVar103);
    local_420._0_4_ = fVar135 + fVar137 * auVar16._0_4_;
    local_420._4_4_ = fVar144 + fVar143 * auVar16._4_4_;
    fStack_418 = fVar149 + fVar145 * auVar16._8_4_;
    fStack_414 = fVar153 + fVar147 * auVar16._12_4_;
    fStack_410 = auVar16._16_4_ * 0.0 + 0.0;
    fStack_40c = auVar16._20_4_ * 0.0 + 0.0;
    fStack_408 = auVar16._24_4_ * 0.0 + 0.0;
    register0x0000139c = local_4a0._28_4_ + 0.0;
    auVar86 = vcmpps_avx(_local_420,auVar170,6);
    auVar15 = vcmpps_avx(_local_420,auVar95,1);
    auVar86 = vandps_avx(auVar15,auVar86);
    auVar21 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
    auVar21 = vpand_avx(auVar65,auVar21);
    auVar15 = vpmovsxwd_avx2(auVar21);
    local_4c0 = vblendvps_avx(auVar105,auVar16,auVar15);
    auVar21 = vpackssdw_avx(auVar17._0_16_,auVar17._16_16_);
    auVar86 = vrcpps_avx(ZEXT1632(auVar20));
    auVar20 = vfnmadd213ps_fma(auVar86,ZEXT1632(auVar20),auVar160);
    auVar19 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar86,auVar86);
    auVar35._4_4_ = fVar143 * (float)local_520._4_4_;
    auVar35._0_4_ = fVar137 * (float)local_520._0_4_;
    auVar35._8_4_ = fVar145 * fStack_518;
    auVar35._12_4_ = fVar147 * fStack_514;
    auVar35._16_4_ = fStack_510 * 0.0;
    auVar35._20_4_ = fStack_50c * 0.0;
    auVar35._24_4_ = fStack_508 * 0.0;
    auVar35._28_4_ = auVar86._28_4_;
    auVar36._4_4_ = fVar129 * fVar144;
    auVar36._0_4_ = fVar129 * fVar135;
    auVar36._8_4_ = fVar129 * fVar149;
    auVar36._12_4_ = fVar129 * fVar153;
    auVar36._16_4_ = fVar129 * 0.0;
    auVar36._20_4_ = fVar129 * 0.0;
    auVar36._24_4_ = fVar129 * 0.0;
    auVar36._28_4_ = auVar15._28_4_;
    auVar86 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = fVar143 * (float)local_460._4_4_;
    auVar37._0_4_ = fVar137 * (float)local_460._0_4_;
    auVar37._8_4_ = fVar145 * fStack_458;
    auVar37._12_4_ = fVar147 * fStack_454;
    auVar37._16_4_ = fStack_450 * 0.0;
    auVar37._20_4_ = fStack_44c * 0.0;
    auVar37._24_4_ = fStack_448 * 0.0;
    auVar37._28_4_ = auVar15._28_4_;
    auVar171._0_4_ = fVar135 * fStack_84;
    auVar171._4_4_ = fVar144 * fStack_84;
    auVar171._8_4_ = fVar149 * fStack_84;
    auVar171._12_4_ = fVar153 * fStack_84;
    auVar171._16_4_ = fStack_84 * 0.0;
    auVar171._20_4_ = fStack_84 * 0.0;
    auVar171._24_4_ = fStack_84 * 0.0;
    auVar171._28_4_ = 0;
    auVar15 = vsubps_avx(auVar37,auVar171);
    auVar38._4_4_ = fVar143 * fVar176;
    auVar38._0_4_ = fVar137 * fVar173;
    auVar38._8_4_ = fVar145 * fVar177;
    auVar38._12_4_ = fVar147 * fVar178;
    auVar38._16_4_ = fVar179 * 0.0;
    auVar38._20_4_ = fVar180 * 0.0;
    auVar38._24_4_ = fVar181 * 0.0;
    auVar38._28_4_ = 0;
    auVar174._0_4_ = local_320 * fVar135;
    auVar174._4_4_ = local_320 * fVar144;
    auVar174._8_4_ = local_320 * fVar149;
    auVar174._12_4_ = local_320 * fVar153;
    auVar174._16_4_ = local_320 * 0.0;
    auVar174._20_4_ = local_320 * 0.0;
    auVar174._24_4_ = local_320 * 0.0;
    auVar174._28_4_ = 0;
    auVar16 = vsubps_avx(auVar38,auVar174);
    auVar39._4_4_ = auVar16._4_4_ * auVar16._4_4_;
    auVar39._0_4_ = auVar16._0_4_ * auVar16._0_4_;
    auVar39._8_4_ = auVar16._8_4_ * auVar16._8_4_;
    auVar39._12_4_ = auVar16._12_4_ * auVar16._12_4_;
    auVar39._16_4_ = auVar16._16_4_ * auVar16._16_4_;
    auVar39._20_4_ = auVar16._20_4_ * auVar16._20_4_;
    auVar39._24_4_ = auVar16._24_4_ * auVar16._24_4_;
    auVar39._28_4_ = auVar16._28_4_;
    auVar20 = vfmadd231ps_fma(auVar39,auVar15,auVar15);
    auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar86,auVar86);
    auVar40._4_4_ = fStack_33c * fStack_33c * fVar156;
    auVar40._0_4_ = local_340 * local_340 * fVar154;
    auVar40._8_4_ = fStack_338 * fStack_338 * fVar157;
    auVar40._12_4_ = fStack_334 * fStack_334 * fVar158;
    auVar40._16_4_ = fStack_330 * fStack_330 * 0.0;
    auVar40._20_4_ = fStack_32c * fStack_32c * 0.0;
    auVar40._24_4_ = fStack_328 * fStack_328 * 0.0;
    auVar40._28_4_ = fVar14;
    auVar86 = vcmpps_avx(ZEXT1632(auVar20),auVar40,1);
    auVar20 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
    auVar20 = vpand_avx(auVar21,auVar20);
    auVar41._4_4_ = auVar19._4_4_ * -fVar144;
    auVar41._0_4_ = auVar19._0_4_ * -fVar135;
    auVar41._8_4_ = auVar19._8_4_ * -fVar149;
    auVar41._12_4_ = auVar19._12_4_ * -fVar153;
    auVar41._16_4_ = 0x80000000;
    auVar41._20_4_ = 0x80000000;
    auVar41._24_4_ = 0x80000000;
    auVar41._28_4_ = 0x80000000;
    auVar20 = vpand_avx(auVar65,auVar20);
    auVar86 = vpmovsxwd_avx2(auVar20);
    auVar85._8_4_ = 0x7f800000;
    auVar85._0_8_ = 0x7f8000007f800000;
    auVar85._12_4_ = 0x7f800000;
    auVar85._16_4_ = 0x7f800000;
    auVar85._20_4_ = 0x7f800000;
    auVar85._24_4_ = 0x7f800000;
    auVar85._28_4_ = 0x7f800000;
    auVar15 = vblendvps_avx(auVar85,auVar41,auVar86);
    auVar42._4_4_ = auVar77._4_4_ * fVar169;
    auVar42._0_4_ = auVar77._0_4_ * fVar167;
    auVar42._8_4_ = auVar77._8_4_ * fVar146;
    auVar42._12_4_ = auVar77._12_4_ * fVar150;
    auVar42._16_4_ = auVar77._16_4_ * fVar159;
    auVar42._20_4_ = auVar77._20_4_ * fVar162;
    auVar42._24_4_ = auVar77._24_4_ * fVar164;
    auVar42._28_4_ = 0x80000000;
    auVar20 = vfmadd231ps_fma(auVar42,auVar90,local_1e0);
    auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar73,local_1c0);
    auVar43._4_4_ = fVar143 * auVar73._4_4_;
    auVar43._0_4_ = fVar137 * auVar73._0_4_;
    auVar43._8_4_ = fVar145 * auVar73._8_4_;
    auVar43._12_4_ = fVar147 * auVar73._12_4_;
    auVar43._16_4_ = auVar73._16_4_ * 0.0;
    auVar43._20_4_ = auVar73._20_4_ * 0.0;
    auVar43._24_4_ = auVar73._24_4_ * 0.0;
    auVar43._28_4_ = auVar73._28_4_;
    auVar44._4_4_ = fVar143 * auVar90._4_4_;
    auVar44._0_4_ = fVar137 * auVar90._0_4_;
    auVar44._8_4_ = fVar145 * auVar90._8_4_;
    auVar44._12_4_ = fVar147 * auVar90._12_4_;
    auVar44._16_4_ = auVar90._16_4_ * 0.0;
    auVar44._20_4_ = auVar90._20_4_ * 0.0;
    auVar44._24_4_ = auVar90._24_4_ * 0.0;
    auVar44._28_4_ = auVar90._28_4_;
    auVar45._4_4_ = fVar143 * auVar77._4_4_;
    auVar45._0_4_ = fVar137 * auVar77._0_4_;
    auVar45._8_4_ = fVar145 * auVar77._8_4_;
    auVar45._12_4_ = fVar147 * auVar77._12_4_;
    auVar45._16_4_ = auVar77._16_4_ * 0.0;
    auVar45._20_4_ = auVar77._20_4_ * 0.0;
    auVar45._24_4_ = auVar77._24_4_ * 0.0;
    auVar45._28_4_ = auVar77._28_4_;
    fVar135 = auVar20._0_4_;
    auVar141._0_4_ = fVar129 * fVar135;
    fVar144 = auVar20._4_4_;
    auVar141._4_4_ = fVar129 * fVar144;
    fVar149 = auVar20._8_4_;
    auVar141._8_4_ = fVar129 * fVar149;
    fVar153 = auVar20._12_4_;
    auVar141._12_4_ = fVar129 * fVar153;
    auVar141._16_4_ = fVar129 * 0.0;
    auVar141._20_4_ = fVar129 * 0.0;
    auVar141._24_4_ = fVar129 * 0.0;
    auVar141._28_4_ = 0;
    auVar86 = vsubps_avx(auVar43,auVar141);
    auVar46._4_4_ = fStack_84 * fVar144;
    auVar46._0_4_ = fStack_84 * fVar135;
    auVar46._8_4_ = fStack_84 * fVar149;
    auVar46._12_4_ = fStack_84 * fVar153;
    auVar46._16_4_ = fStack_84 * 0.0;
    auVar46._20_4_ = fStack_84 * 0.0;
    auVar46._24_4_ = fStack_84 * 0.0;
    auVar46._28_4_ = 0;
    auVar16 = vsubps_avx(auVar44,auVar46);
    auVar47._4_4_ = local_320 * fVar144;
    auVar47._0_4_ = local_320 * fVar135;
    auVar47._8_4_ = local_320 * fVar149;
    auVar47._12_4_ = local_320 * fVar153;
    auVar47._16_4_ = local_320 * 0.0;
    auVar47._20_4_ = local_320 * 0.0;
    auVar47._24_4_ = local_320 * 0.0;
    auVar47._28_4_ = 0;
    auVar17 = vsubps_avx(auVar45,auVar47);
    auVar48._4_4_ = auVar17._4_4_ * auVar17._4_4_;
    auVar48._0_4_ = auVar17._0_4_ * auVar17._0_4_;
    auVar48._8_4_ = auVar17._8_4_ * auVar17._8_4_;
    auVar48._12_4_ = auVar17._12_4_ * auVar17._12_4_;
    auVar48._16_4_ = auVar17._16_4_ * auVar17._16_4_;
    auVar48._20_4_ = auVar17._20_4_ * auVar17._20_4_;
    auVar48._24_4_ = auVar17._24_4_ * auVar17._24_4_;
    auVar48._28_4_ = auVar17._28_4_;
    auVar20 = vfmadd231ps_fma(auVar48,auVar16,auVar16);
    auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar86,auVar86);
    local_440._0_4_ = auVar84._0_4_;
    local_440._4_4_ = auVar84._4_4_;
    fStack_438 = auVar84._8_4_;
    fStack_434 = auVar84._12_4_;
    fStack_430 = auVar84._16_4_;
    fStack_42c = auVar84._20_4_;
    fStack_428 = auVar84._24_4_;
    auVar49._4_4_ = (float)local_440._4_4_ * (float)local_440._4_4_ * fVar156;
    auVar49._0_4_ = (float)local_440._0_4_ * (float)local_440._0_4_ * fVar154;
    auVar49._8_4_ = fStack_438 * fStack_438 * fVar157;
    auVar49._12_4_ = fStack_434 * fStack_434 * fVar158;
    auVar49._16_4_ = fStack_430 * fStack_430 * 0.0;
    auVar49._20_4_ = fStack_42c * fStack_42c * 0.0;
    auVar49._24_4_ = fStack_428 * fStack_428 * 0.0;
    auVar49._28_4_ = auVar16._28_4_;
    uVar75 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar71._4_4_ = uVar75;
    auVar71._0_4_ = uVar75;
    auVar71._8_4_ = uVar75;
    auVar71._12_4_ = uVar75;
    auVar71._16_4_ = uVar75;
    auVar71._20_4_ = uVar75;
    auVar71._24_4_ = uVar75;
    auVar71._28_4_ = uVar75;
    auVar86 = vcmpps_avx(ZEXT1632(auVar20),auVar49,1);
    auVar20 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
    auVar76 = vpand_avx(auVar20,auVar76);
    auVar50._4_4_ = auVar19._4_4_ * -fVar144;
    auVar50._0_4_ = auVar19._0_4_ * -fVar135;
    auVar50._8_4_ = auVar19._8_4_ * -fVar149;
    auVar50._12_4_ = auVar19._12_4_ * -fVar153;
    auVar50._16_4_ = 0x80000000;
    auVar50._20_4_ = 0x80000000;
    auVar50._24_4_ = 0x80000000;
    auVar50._28_4_ = 0x80000000;
    auVar76 = vpand_avx(auVar65,auVar76);
    auVar86 = vpmovsxwd_avx2(auVar76);
    auVar82._8_4_ = 0x7f800000;
    auVar82._0_8_ = 0x7f8000007f800000;
    auVar82._12_4_ = 0x7f800000;
    auVar82._16_4_ = 0x7f800000;
    auVar82._20_4_ = 0x7f800000;
    auVar82._24_4_ = 0x7f800000;
    auVar82._28_4_ = 0x7f800000;
    auVar86 = vblendvps_avx(auVar82,auVar50,auVar86);
    auVar73 = vminps_avx(auVar15,auVar86);
    auVar16 = vmaxps_avx(auVar15,auVar86);
    auVar77 = vminps_avx(local_4a0,auVar73);
    auVar17 = vcmpps_avx(auVar77,auVar73,0);
    auVar86 = vcmpps_avx(auVar16,auVar82,0);
    auVar152._8_4_ = 0xff800000;
    auVar152._0_8_ = 0xff800000ff800000;
    auVar152._12_4_ = 0xff800000;
    auVar152._16_4_ = 0xff800000;
    auVar152._20_4_ = 0xff800000;
    auVar152._24_4_ = 0xff800000;
    auVar152._28_4_ = 0xff800000;
    auVar86 = vblendvps_avx(auVar16,auVar152,auVar86);
    auVar16 = vcmpps_avx(auVar73,auVar82,0);
    auVar16 = vblendvps_avx(auVar73,auVar152,auVar16);
    auVar16 = vblendvps_avx(auVar16,auVar86,auVar17);
    auVar94._0_4_ = fVar116 + auVar77._0_4_;
    auVar94._4_4_ = fVar121 + auVar77._4_4_;
    auVar94._8_4_ = fVar124 + auVar77._8_4_;
    auVar94._12_4_ = fVar127 + auVar77._12_4_;
    auVar94._16_4_ = auVar77._16_4_ + 0.0;
    auVar94._20_4_ = auVar77._20_4_ + 0.0;
    auVar94._24_4_ = auVar77._24_4_ + 0.0;
    auVar94._28_4_ = auVar77._28_4_ + 0.0;
    auVar86 = vcmpps_avx(auVar71,auVar94,2);
    fStack_384 = ray->tfar;
    auVar142._4_4_ = fStack_384;
    auVar142._0_4_ = fStack_384;
    auVar142._8_4_ = fStack_384;
    auVar142._12_4_ = fStack_384;
    auVar142._16_4_ = fStack_384;
    auVar142._20_4_ = fStack_384;
    auVar142._24_4_ = fStack_384;
    auVar142._28_4_ = fStack_384;
    auVar17 = vcmpps_avx(auVar94,auVar142,2);
    auVar86 = vandps_avx(auVar86,auVar17);
    local_80 = vmaxps_avx(local_4c0,auVar16);
    auVar16 = vcmpps_avx(auVar77,auVar82,4);
    auVar86 = vandps_avx(auVar86,auVar16);
    auVar76 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
    local_360 = vpand_avx(auVar65,auVar76);
    local_4e0._0_4_ = fVar116 + local_80._0_4_;
    local_4e0._4_4_ = fVar121 + local_80._4_4_;
    local_4e0._8_4_ = fVar124 + local_80._8_4_;
    local_4e0._12_4_ = fVar127 + local_80._12_4_;
    local_4e0._16_4_ = local_80._16_4_ + 0.0;
    local_4e0._20_4_ = local_80._20_4_ + 0.0;
    local_4e0._24_4_ = local_80._24_4_ + 0.0;
    local_4e0._28_4_ = local_80._28_4_ + 0.0;
    auVar86 = vcmpps_avx(auVar71,local_4e0,2);
    auVar16 = vcmpps_avx(local_4e0,auVar142,2);
    auVar86 = vandps_avx(auVar86,auVar16);
    auVar16 = vcmpps_avx(auVar152,local_80,4);
    auVar86 = vandps_avx(auVar86,auVar16);
    auVar76 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
    local_380 = vpand_avx(auVar65,auVar76);
    local_480 = vpor_avx(local_360,local_380);
    auVar86 = vpmovsxwd_avx2(local_480);
    if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar86 >> 0x7f,0) != '\0') ||
          (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar86 >> 0xbf,0) != '\0') ||
        (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar86[0x1f] < '\0')
    {
      auStack_350 = auVar90._16_16_;
      auVar86 = vpmovzxwd_avx2(local_360);
      auVar86 = vpslld_avx2(auVar86,0x1f);
      auVar16 = vblendvps_avx(local_80,auVar77,auVar86);
      auVar86 = vblendvps_avx(_local_420,auVar106,auVar86);
      auVar17 = vrcpps_avx(auVar95);
      auVar168._8_4_ = 0x3f800000;
      auVar168._0_8_ = &DAT_3f8000003f800000;
      auVar168._12_4_ = 0x3f800000;
      auVar168._16_4_ = 0x3f800000;
      auVar168._20_4_ = 0x3f800000;
      auVar168._24_4_ = 0x3f800000;
      auVar168._28_4_ = 0x3f800000;
      auVar76 = vfnmadd213ps_fma(auVar17,auVar95,auVar168);
      auVar21 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar17,auVar17);
      local_340 = fVar118 * fVar133 * local_340;
      fStack_33c = fVar123 * fVar138 * fStack_33c;
      fStack_338 = fVar126 * fVar148 * fStack_338;
      fStack_334 = fVar131 * fVar151 * fStack_334;
      fStack_330 = fVar161 * 0.0 * fStack_330;
      fStack_32c = fVar163 * 0.0 * fStack_32c;
      fStack_328 = fVar165 * 0.0 * fStack_328;
      local_3a0 = local_340 * local_1c0._0_4_;
      fStack_39c = fStack_33c * local_1c0._4_4_;
      fVar131 = local_1c0._8_4_;
      fVar138 = local_1c0._12_4_;
      fVar149 = local_1c0._16_4_;
      fVar161 = local_1c0._20_4_;
      fVar14 = local_1c0._24_4_;
      local_3c0 = local_1e0._0_4_ * local_340;
      fStack_3bc = local_1e0._4_4_ * fStack_33c;
      fVar128 = local_1e0._8_4_;
      fVar130 = local_1e0._12_4_;
      fVar132 = local_1e0._16_4_;
      fVar134 = local_1e0._20_4_;
      fVar137 = local_1e0._24_4_;
      fStack_3a4 = local_1e0._28_4_;
      auStack_470 = auVar66._16_16_;
      local_a0 = local_1c0._0_4_ * fVar102;
      fStack_9c = local_1c0._4_4_ * fVar110;
      auVar66 = vcmpps_avx(auVar16,local_4a0,0);
      auVar17 = vcmpps_avx(auVar16,local_4c0,0);
      auVar66 = vorps_avx(auVar66,auVar17);
      auVar76 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
      auVar20 = vpand_avx(auVar65,auVar76);
      auVar66 = vcmpps_avx(auVar16,auVar15,0);
      auVar76 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
      auVar65 = vpand_avx(auVar65,auVar76);
      fVar118 = auVar16._0_4_;
      fVar126 = auVar16._4_4_;
      fVar133 = auVar16._8_4_;
      fVar144 = auVar16._12_4_;
      fVar151 = auVar16._16_4_;
      fVar163 = auVar16._20_4_;
      fVar122 = auVar16._24_4_;
      fStack_398 = fStack_338 * fVar131;
      fStack_394 = fStack_334 * fVar138;
      fStack_390 = fStack_330 * fVar149;
      fStack_38c = fStack_32c * fVar161;
      fStack_388 = fStack_328 * fVar14;
      auVar99._0_4_ = local_3a0 + fVar83 * (fVar129 * fVar118 + (float)local_520._0_4_);
      auVar99._4_4_ = fStack_39c + fVar87 * (fVar129 * fVar126 + (float)local_520._4_4_);
      auVar99._8_4_ = fStack_338 * fVar131 + fVar88 * (fVar129 * fVar133 + fStack_518);
      auVar99._12_4_ = fStack_334 * fVar138 + fVar89 * (fVar129 * fVar144 + fStack_514);
      auVar99._16_4_ = fStack_330 * fVar149 + (fVar129 * fVar151 + fStack_510) * 0.0;
      auVar99._20_4_ = fStack_32c * fVar161 + (fVar129 * fVar163 + fStack_50c) * 0.0;
      auVar99._24_4_ = fStack_328 * fVar14 + (fVar129 * fVar122 + fStack_508) * 0.0;
      auVar99._28_4_ = fStack_384 + fVar136 + 0.0;
      fStack_98 = fVar131 * fVar111;
      fStack_94 = fVar138 * fVar112;
      fStack_90 = fVar149 * fVar113;
      fStack_8c = fVar161 * fVar114;
      fStack_88 = fVar14 * fVar115;
      fVar123 = auVar86._0_4_;
      fVar129 = auVar86._4_4_;
      auVar51._4_4_ = fStack_9c * fVar129;
      auVar51._0_4_ = local_a0 * fVar123;
      fVar135 = auVar86._8_4_;
      auVar51._8_4_ = fVar131 * fVar111 * fVar135;
      fVar148 = auVar86._12_4_;
      auVar51._12_4_ = fVar138 * fVar112 * fVar148;
      fVar153 = auVar86._16_4_;
      auVar51._16_4_ = fVar149 * fVar113 * fVar153;
      fVar165 = auVar86._20_4_;
      auVar51._20_4_ = fVar161 * fVar114 * fVar165;
      fVar125 = auVar86._24_4_;
      auVar51._24_4_ = fVar14 * fVar115 * fVar125;
      auVar51._28_4_ = fStack_84;
      auVar66 = vsubps_avx(auVar99,auVar51);
      fStack_3b8 = fVar128 * fStack_338;
      fStack_3b4 = fVar130 * fStack_334;
      fStack_3b0 = fVar132 * fStack_330;
      fStack_3ac = fVar134 * fStack_32c;
      fStack_3a8 = fVar137 * fStack_328;
      auVar120._0_4_ = local_3c0 + fVar83 * (fStack_84 * fVar118 + (float)local_460._0_4_);
      auVar120._4_4_ = fStack_3bc + fVar87 * (fStack_84 * fVar126 + (float)local_460._4_4_);
      auVar120._8_4_ = fVar128 * fStack_338 + fVar88 * (fStack_84 * fVar133 + fStack_458);
      auVar120._12_4_ = fVar130 * fStack_334 + fVar89 * (fStack_84 * fVar144 + fStack_454);
      auVar120._16_4_ = fVar132 * fStack_330 + (fStack_84 * fVar151 + fStack_450) * 0.0;
      auVar120._20_4_ = fVar134 * fStack_32c + (fStack_84 * fVar163 + fStack_44c) * 0.0;
      auVar120._24_4_ = fVar137 * fStack_328 + (fStack_84 * fVar122 + fStack_448) * 0.0;
      auVar120._28_4_ = fStack_3a4 + fStack_84 + fVar117;
      local_c0 = local_1e0._0_4_ * fVar102;
      fStack_bc = local_1e0._4_4_ * fVar110;
      fStack_b8 = fVar128 * fVar111;
      fStack_b4 = fVar130 * fVar112;
      fStack_b0 = fVar132 * fVar113;
      fStack_ac = fVar134 * fVar114;
      fStack_a8 = fVar137 * fVar115;
      fStack_a4 = fStack_84;
      auVar52._4_4_ = fVar129 * fStack_bc;
      auVar52._0_4_ = fVar123 * local_c0;
      auVar52._8_4_ = fVar135 * fVar128 * fVar111;
      auVar52._12_4_ = fVar148 * fVar130 * fVar112;
      auVar52._16_4_ = fVar153 * fVar132 * fVar113;
      auVar52._20_4_ = fVar165 * fVar134 * fVar114;
      auVar52._24_4_ = fVar125 * fVar137 * fVar115;
      auVar52._28_4_ = fStack_384;
      auVar17 = vsubps_avx(auVar120,auVar52);
      auVar95 = vpmovsxwd_avx2(auVar20);
      auVar73 = vpmovsxwd_avx2(auVar65);
      local_e0._0_8_ = local_1c0._0_8_ ^ 0x8000000080000000;
      local_e0._8_4_ = -fVar131;
      local_e0._12_4_ = -fVar138;
      local_e0._16_4_ = -fVar149;
      local_e0._20_4_ = -fVar161;
      local_e0._24_4_ = -fVar14;
      fStack_324 = local_1c0._28_4_;
      local_e0._28_4_ = -fStack_324;
      auVar86 = vblendvps_avx(local_1c0,local_e0,auVar73);
      local_2a0 = vblendvps_avx(auVar86,auVar66,auVar95);
      auVar175 = ZEXT3264(local_400);
      local_340 = fVar167 * local_340;
      fStack_33c = fVar169 * fStack_33c;
      fStack_338 = fVar146 * fStack_338;
      fStack_334 = fVar150 * fStack_334;
      fStack_330 = fVar159 * fStack_330;
      fStack_32c = fVar162 * fStack_32c;
      fStack_328 = fVar164 * fStack_328;
      fVar167 = fVar167 * fVar102;
      fVar169 = fVar169 * fVar110;
      fVar111 = fVar146 * fVar111;
      fVar112 = fVar150 * fVar112;
      fVar113 = fVar159 * fVar113;
      fVar114 = fVar162 * fVar114;
      fVar115 = fVar164 * fVar115;
      uVar75 = 0x3f800000;
      auVar96._0_4_ = local_340 + fVar83 * (fVar173 + fVar118 * local_320);
      auVar96._4_4_ = fStack_33c + fVar87 * (fVar176 + fVar126 * local_320);
      auVar96._8_4_ = fStack_338 + fVar88 * (fVar177 + fVar133 * local_320);
      auVar96._12_4_ = fStack_334 + fVar89 * (fVar178 + fVar144 * local_320);
      auVar96._16_4_ = fStack_330 + (fVar179 + fVar151 * local_320) * 0.0;
      auVar96._20_4_ = fStack_32c + (fVar180 + fVar163 * local_320) * 0.0;
      auVar96._24_4_ = fStack_328 + (fVar181 + fVar122 * local_320) * 0.0;
      auVar96._28_4_ = fStack_324 + fStack_3c4 + fVar166 + 0.0;
      auVar53._4_4_ = fVar169 * fVar129;
      auVar53._0_4_ = fVar167 * fVar123;
      auVar53._8_4_ = fVar111 * fVar135;
      auVar53._12_4_ = fVar112 * fVar148;
      auVar53._16_4_ = fVar113 * fVar153;
      auVar53._20_4_ = fVar114 * fVar165;
      auVar53._24_4_ = fVar115 * fVar125;
      auVar53._28_4_ = auVar86._28_4_;
      local_100._0_8_ = local_1e0._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar128;
      local_100._12_4_ = -fVar130;
      local_100._16_4_ = -fVar132;
      local_100._20_4_ = -fVar134;
      local_100._24_4_ = -fVar137;
      local_100._28_4_ = -fStack_3a4;
      auVar86 = vblendvps_avx(local_1e0,local_100,auVar73);
      auVar66 = vsubps_avx(auVar96,auVar53);
      local_280 = vblendvps_avx(auVar86,auVar17,auVar95);
      local_120._0_8_ = local_400._0_8_ ^ 0x8000000080000000;
      local_120._8_4_ = -fVar146;
      local_120._12_4_ = -fVar150;
      local_120._16_4_ = -fVar159;
      local_120._20_4_ = -fVar162;
      local_120._24_4_ = -fVar164;
      local_120._28_4_ = -fVar166;
      auVar86 = vblendvps_avx(local_400,local_120,auVar73);
      local_260 = vblendvps_avx(auVar86,auVar66,auVar95);
      auVar107._8_4_ = 0x3f800000;
      auVar107._0_8_ = &DAT_3f8000003f800000;
      auVar107._12_4_ = 0x3f800000;
      auVar107._16_4_ = 0x3f800000;
      auVar107._20_4_ = 0x3f800000;
      auVar107._24_4_ = 0x3f800000;
      auVar107._28_4_ = 0x3f800000;
      auVar86 = vandnps_avx(auVar73,auVar107);
      auVar172 = ZEXT3264(auVar86);
      _local_500 = ZEXT1632(auVar21);
      auVar54._4_4_ = fVar129 * auVar21._4_4_;
      auVar54._0_4_ = fVar123 * auVar21._0_4_;
      auVar54._8_4_ = fVar135 * auVar21._8_4_;
      auVar54._12_4_ = fVar148 * auVar21._12_4_;
      auVar54._16_4_ = fVar153 * 0.0;
      auVar54._20_4_ = fVar165 * 0.0;
      auVar54._24_4_ = fVar125 * 0.0;
      auVar54._28_4_ = auVar73._28_4_;
      local_300 = vblendvps_avx(auVar86,auVar54,auVar95);
      local_2c0._0_4_ = fVar118 + fVar116;
      local_2c0._4_4_ = fVar126 + fVar121;
      local_2c0._8_4_ = fVar133 + fVar124;
      local_2c0._12_4_ = fVar144 + fVar127;
      local_2c0._16_4_ = fVar151 + 0.0;
      local_2c0._20_4_ = fVar163 + 0.0;
      local_2c0._24_4_ = fVar122 + 0.0;
      local_2c0._28_4_ = auVar16._28_4_ + 0.0;
      local_2e0 = ZEXT832(0) << 0x20;
      auVar65 = vpsllw_avx(local_480,0xf);
      auVar65 = vpacksswb_avx(auVar65,auVar65);
      uVar64 = (ulong)(byte)(SUB161(auVar65 >> 7,0) & 1 | (SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar65 >> 0x37,0) & 1) << 6 | SUB161(auVar65 >> 0x3f,0) << 7);
      auVar101 = ZEXT3264(local_4a0);
      auVar109 = ZEXT3264(local_4c0);
      auVar155 = ZEXT3264(local_4e0);
      fVar118 = (float)local_520._0_4_;
      fVar123 = (float)local_520._4_4_;
      fVar126 = fStack_518;
      fVar129 = fStack_514;
      fVar131 = fStack_510;
      fVar133 = fStack_50c;
      fVar135 = fStack_508;
      fVar138 = (float)local_460._0_4_;
      fVar144 = (float)local_460._4_4_;
      fVar146 = fStack_458;
      fVar148 = fStack_454;
      fVar149 = fStack_450;
      fVar150 = fStack_44c;
      fVar151 = fStack_448;
      fVar153 = fStack_3c4;
      local_5a0 = context;
      local_598 = pSVar62;
      local_528 = line;
      _local_440 = auVar15;
      fStack_31c = local_320;
      fStack_318 = local_320;
      fStack_314 = local_320;
      fStack_310 = local_320;
      fStack_30c = local_320;
      fStack_308 = local_320;
      fStack_304 = local_320;
      do {
        local_590.valid = &local_5a4;
        uVar18 = 0;
        for (uVar61 = uVar64; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
          uVar18 = uVar18 + 1;
        }
        local_548 = local_140[uVar18];
        pGVar11 = (pSVar62->geometries).items[local_548].ptr;
        local_590.ray = (RTCRayN *)ray;
        if ((pGVar11->mask & ray->mask) == 0) {
LAB_017fc6a6:
          uVar64 = uVar64 ^ 1L << (uVar18 & 0x3f);
          bVar60 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            uVar61 = (ulong)(uint)((int)uVar18 * 4);
            local_554 = *(undefined4 *)(local_300 + uVar61);
            local_550 = *(undefined4 *)(local_2e0 + uVar61);
            local_54c = *(undefined4 *)((long)&(local_528->primIDs).field_0 + uVar61);
            local_560 = *(undefined4 *)(local_2a0 + uVar61);
            local_55c = *(undefined4 *)(local_280 + uVar61);
            local_558 = *(undefined4 *)(local_260 + uVar61);
            local_544 = context->user->instID[0];
            local_540 = context->user->instPrimID[0];
            local_480._0_4_ = ray->tfar;
            ray->tfar = *(float *)(local_2c0 + uVar61);
            local_5a4 = -1;
            local_590.geometryUserPtr = pGVar11->userPtr;
            local_590.context = context->user;
            local_590.N = 1;
            local_220 = fVar167;
            fStack_21c = fVar169;
            fStack_218 = fVar111;
            fStack_214 = fVar112;
            fStack_210 = fVar113;
            fStack_20c = fVar114;
            fStack_208 = fVar115;
            uStack_204 = uVar75;
            local_240 = auVar172._0_32_;
            local_590.hit = (RTCHitN *)&local_560;
            if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar11->occlusionFilterN)(&local_590);
              auVar172 = ZEXT3264(local_240);
              auVar155 = ZEXT3264(local_4e0);
              auVar109 = ZEXT3264(local_4c0);
              auVar101 = ZEXT3264(local_4a0);
              auVar175 = ZEXT3264(local_400);
              pSVar62 = local_598;
              context = local_5a0;
              fVar118 = (float)local_520._0_4_;
              fVar123 = (float)local_520._4_4_;
              fVar126 = fStack_518;
              fVar129 = fStack_514;
              fVar131 = fStack_510;
              fVar133 = fStack_50c;
              fVar135 = fStack_508;
              fVar136 = fStack_504;
              fVar138 = (float)local_460._0_4_;
              fVar144 = (float)local_460._4_4_;
              fVar146 = fStack_458;
              fVar148 = fStack_454;
              fVar149 = fStack_450;
              fVar150 = fStack_44c;
              fVar151 = fStack_448;
              fVar117 = fStack_444;
              fVar173 = (float)local_3e0._0_4_;
              fVar176 = (float)local_3e0._4_4_;
              fVar177 = fStack_3d8;
              fVar178 = fStack_3d4;
              fVar179 = fStack_3d0;
              fVar180 = fStack_3cc;
              fVar181 = fStack_3c8;
              fVar153 = fStack_3c4;
              if (*local_590.valid != 0) goto LAB_017fc81d;
LAB_017fc8b8:
              ray->tfar = (float)local_480._0_4_;
              fVar167 = local_220;
              fVar169 = fStack_21c;
              fVar111 = fStack_218;
              fVar112 = fStack_214;
              fVar113 = fStack_210;
              fVar114 = fStack_20c;
              fVar115 = fStack_208;
              uVar75 = uStack_204;
              goto LAB_017fc6a6;
            }
LAB_017fc81d:
            p_Var13 = context->args->filter;
            fVar167 = local_220;
            fVar169 = fStack_21c;
            fVar111 = fStack_218;
            fVar112 = fStack_214;
            fVar113 = fStack_210;
            fVar114 = fStack_20c;
            fVar115 = fStack_208;
            uVar75 = uStack_204;
            if (p_Var13 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var13)(&local_590);
                auVar172 = ZEXT3264(local_240);
                auVar155 = ZEXT3264(local_4e0);
                auVar109 = ZEXT3264(local_4c0);
                auVar101 = ZEXT3264(local_4a0);
                auVar175 = ZEXT3264(local_400);
                pSVar62 = local_598;
                context = local_5a0;
                fVar118 = (float)local_520._0_4_;
                fVar123 = (float)local_520._4_4_;
                fVar126 = fStack_518;
                fVar129 = fStack_514;
                fVar131 = fStack_510;
                fVar133 = fStack_50c;
                fVar135 = fStack_508;
                fVar136 = fStack_504;
                fVar138 = (float)local_460._0_4_;
                fVar144 = (float)local_460._4_4_;
                fVar146 = fStack_458;
                fVar148 = fStack_454;
                fVar149 = fStack_450;
                fVar150 = fStack_44c;
                fVar151 = fStack_448;
                fVar117 = fStack_444;
                fVar173 = (float)local_3e0._0_4_;
                fVar176 = (float)local_3e0._4_4_;
                fVar177 = fStack_3d8;
                fVar178 = fStack_3d4;
                fVar179 = fStack_3d0;
                fVar180 = fStack_3cc;
                fVar181 = fStack_3c8;
                fVar153 = fStack_3c4;
              }
              fVar167 = local_220;
              fVar169 = fStack_21c;
              fVar111 = fStack_218;
              fVar112 = fStack_214;
              fVar113 = fStack_210;
              fVar114 = fStack_20c;
              fVar115 = fStack_208;
              uVar75 = uStack_204;
              if (*local_590.valid == 0) goto LAB_017fc8b8;
            }
          }
          bVar60 = 0;
        }
      } while ((bool)(uVar64 != 0 & bVar60));
      fVar159 = ray->tfar;
      auVar72._4_4_ = fVar159;
      auVar72._0_4_ = fVar159;
      auVar72._8_4_ = fVar159;
      auVar72._12_4_ = fVar159;
      auVar72._16_4_ = fVar159;
      auVar72._20_4_ = fVar159;
      auVar72._24_4_ = fVar159;
      auVar72._28_4_ = fVar159;
      auVar76 = vpand_avx(local_380,local_360);
      auVar86 = vcmpps_avx(auVar155._0_32_,auVar72,2);
      auVar65 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
      auVar65 = vpand_avx(auVar65,auVar76);
      auVar86 = vpmovzxwd_avx2(auVar65);
      auVar86 = vpslld_avx2(auVar86,0x1f);
      if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar86 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar86 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar86 >> 0x7f,0) == '\0') &&
            (auVar86 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar86 >> 0xbf,0) == '\0') &&
          (auVar86 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar86[0x1f])
      {
        return (bool)(bVar60 ^ 1);
      }
      auVar16 = vcmpps_avx(local_80,_local_440,0);
      auVar86 = vblendvps_avx(local_1c0,local_e0,auVar16);
      auVar15 = vblendvps_avx(local_1e0,local_100,auVar16);
      auVar16 = vblendvps_avx(auVar175._0_32_,local_120,auVar16);
      auVar66 = vcmpps_avx(local_80,auVar101._0_32_,0);
      auVar17 = vcmpps_avx(local_80,auVar109._0_32_,0);
      auVar66 = vorps_avx(auVar66,auVar17);
      fVar159 = local_80._0_4_;
      fVar161 = local_80._4_4_;
      fVar162 = local_80._8_4_;
      fVar163 = local_80._12_4_;
      fVar164 = local_80._16_4_;
      fVar165 = local_80._20_4_;
      fVar166 = local_80._24_4_;
      auVar97._0_4_ =
           (float)local_200._0_4_ * (fVar118 + fVar159 * (float)local_1a0._0_4_) + local_3a0;
      auVar97._4_4_ =
           (float)local_200._4_4_ * (fVar123 + fVar161 * (float)local_1a0._4_4_) + fStack_39c;
      auVar97._8_4_ = fStack_1f8 * (fVar126 + fVar162 * fStack_198) + fStack_398;
      auVar97._12_4_ = fStack_1f4 * (fVar129 + fVar163 * fStack_194) + fStack_394;
      auVar97._16_4_ = fStack_1f0 * (fVar131 + fVar164 * fStack_190) + fStack_390;
      auVar97._20_4_ = fStack_1ec * (fVar133 + fVar165 * fStack_18c) + fStack_38c;
      auVar97._24_4_ = fStack_1e8 * (fVar135 + fVar166 * fStack_188) + fStack_388;
      auVar97._28_4_ = fVar136 + auVar17._28_4_ + fStack_384;
      auVar100._0_4_ =
           (float)local_200._0_4_ * (fVar138 + fVar159 * (float)local_180._0_4_) + local_3c0;
      auVar100._4_4_ =
           (float)local_200._4_4_ * (fVar144 + fVar161 * (float)local_180._4_4_) + fStack_3bc;
      auVar100._8_4_ = fStack_1f8 * (fVar146 + fVar162 * fStack_178) + fStack_3b8;
      auVar100._12_4_ = fStack_1f4 * (fVar148 + fVar163 * fStack_174) + fStack_3b4;
      auVar100._16_4_ = fStack_1f0 * (fVar149 + fVar164 * fStack_170) + fStack_3b0;
      auVar100._20_4_ = fStack_1ec * (fVar150 + fVar165 * fStack_16c) + fStack_3ac;
      auVar100._24_4_ = fStack_1e8 * (fVar151 + fVar166 * fStack_168) + fStack_3a8;
      auVar100._28_4_ = fVar117 + auVar101._28_4_ + fStack_3a4;
      auVar108._0_4_ = (float)local_200._0_4_ * (fVar173 + fVar159 * local_320) + local_340;
      auVar108._4_4_ = (float)local_200._4_4_ * (fVar176 + fVar161 * fStack_31c) + fStack_33c;
      auVar108._8_4_ = fStack_1f8 * (fVar177 + fVar162 * fStack_318) + fStack_338;
      auVar108._12_4_ = fStack_1f4 * (fVar178 + fVar163 * fStack_314) + fStack_334;
      auVar108._16_4_ = fStack_1f0 * (fVar179 + fVar164 * fStack_310) + fStack_330;
      auVar108._20_4_ = fStack_1ec * (fVar180 + fVar165 * fStack_30c) + fStack_32c;
      auVar108._24_4_ = fStack_1e8 * (fVar181 + fVar166 * fStack_308) + fStack_328;
      auVar108._28_4_ = fVar153 + auVar109._28_4_ + fStack_324;
      auVar55._4_4_ = (float)local_420._4_4_ * fStack_9c;
      auVar55._0_4_ = (float)local_420._0_4_ * local_a0;
      auVar55._8_4_ = fStack_418 * fStack_98;
      auVar55._12_4_ = fStack_414 * fStack_94;
      auVar55._16_4_ = fStack_410 * fStack_90;
      auVar55._20_4_ = fStack_40c * fStack_8c;
      auVar55._24_4_ = fStack_408 * fStack_88;
      auVar55._28_4_ = uStack_1e4;
      auVar17 = vsubps_avx(auVar97,auVar55);
      auVar56._4_4_ = (float)local_420._4_4_ * fStack_bc;
      auVar56._0_4_ = (float)local_420._0_4_ * local_c0;
      auVar56._8_4_ = fStack_418 * fStack_b8;
      auVar56._12_4_ = fStack_414 * fStack_b4;
      auVar56._16_4_ = fStack_410 * fStack_b0;
      auVar56._20_4_ = fStack_40c * fStack_ac;
      auVar56._24_4_ = fStack_408 * fStack_a8;
      auVar56._28_4_ = uStack_1e4;
      auVar95 = vsubps_avx(auVar100,auVar56);
      auVar57._4_4_ = fVar169 * (float)local_420._4_4_;
      auVar57._0_4_ = fVar167 * (float)local_420._0_4_;
      auVar57._8_4_ = fVar111 * fStack_418;
      auVar57._12_4_ = fVar112 * fStack_414;
      auVar57._16_4_ = fVar113 * fStack_410;
      auVar57._20_4_ = fVar114 * fStack_40c;
      auVar57._24_4_ = fVar115 * fStack_408;
      auVar57._28_4_ = uStack_1e4;
      auVar73 = vsubps_avx(auVar108,auVar57);
      local_2a0 = vblendvps_avx(auVar86,auVar17,auVar66);
      local_280 = vblendvps_avx(auVar15,auVar95,auVar66);
      local_260 = vblendvps_avx(auVar16,auVar73,auVar66);
      auVar58._4_4_ = (float)local_420._4_4_ * (float)local_500._4_4_;
      auVar58._0_4_ = (float)local_420._0_4_ * (float)local_500._0_4_;
      auVar58._8_4_ = fStack_418 * fStack_4f8;
      auVar58._12_4_ = fStack_414 * fStack_4f4;
      auVar58._16_4_ = fStack_410 * fStack_4f0;
      auVar58._20_4_ = fStack_40c * fStack_4ec;
      auVar58._24_4_ = fStack_408 * fStack_4e8;
      auVar58._28_4_ = auVar17._28_4_;
      local_300 = vblendvps_avx(auVar172._0_32_,auVar58,auVar66);
      local_2e0 = ZEXT832(0) << 0x20;
      local_2c0 = auVar155._0_32_;
      auVar65 = vpsllw_avx(auVar65,0xf);
      auVar65 = vpacksswb_avx(auVar65,auVar65);
      auVar63 = (undefined1  [8])context->scene;
      uVar64 = (ulong)(byte)(SUB161(auVar65 >> 7,0) & 1 | (SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar65 >> 0x37,0) & 1) << 6 | SUB161(auVar65 >> 0x3f,0) << 7);
      do {
        local_590.hit = (RTCHitN *)&local_560;
        local_590.valid = &local_5a4;
        uVar18 = 0;
        for (uVar61 = uVar64; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
          uVar18 = uVar18 + 1;
        }
        local_548 = local_140[uVar18];
        pGVar11 = (((Scene *)auVar63)->geometries).items[local_548].ptr;
        if ((pGVar11->mask & ray->mask) == 0) {
LAB_017fca9d:
          uVar64 = uVar64 ^ 1L << (uVar18 & 0x3f);
          bVar59 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            uVar61 = (ulong)(uint)((int)uVar18 * 4);
            local_554 = *(undefined4 *)(local_300 + uVar61);
            local_550 = *(undefined4 *)(local_2e0 + uVar61);
            local_54c = *(undefined4 *)((long)&(local_528->primIDs).field_0 + uVar61);
            local_560 = *(undefined4 *)(local_2a0 + uVar61);
            local_55c = *(undefined4 *)(local_280 + uVar61);
            local_558 = *(undefined4 *)(local_260 + uVar61);
            local_544 = context->user->instID[0];
            local_540 = context->user->instPrimID[0];
            local_460._0_4_ = ray->tfar;
            ray->tfar = *(float *)(local_2c0 + uVar61);
            local_5a4 = -1;
            local_590.geometryUserPtr = pGVar11->userPtr;
            local_590.context = context->user;
            local_590.N = 1;
            local_520 = auVar63;
            local_590.ray = (RTCRayN *)ray;
            if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar11->occlusionFilterN)(&local_590);
              auVar63 = local_520;
              context = local_5a0;
              if (*local_590.valid != 0) goto LAB_017fcbb9;
LAB_017fcc06:
              ray->tfar = (float)local_460._0_4_;
              goto LAB_017fca9d;
            }
LAB_017fcbb9:
            p_Var13 = context->args->filter;
            if (p_Var13 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var13)(&local_590);
                auVar63 = local_520;
                context = local_5a0;
              }
              if (*local_590.valid == 0) goto LAB_017fcc06;
            }
          }
          bVar59 = 0;
        }
        if (!(bool)(uVar64 != 0 & bVar59)) {
          return (bool)(bVar60 ^ 1 | bVar59 ^ 1);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
        return false;
      }